

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O2

void __thiscall xemmai::t_thread::f_join(t_thread *this)

{
  long lVar1;
  wchar_t *pwVar2;
  long in_FS_OFFSET;
  wstring_view a_message;
  size_t sStack_40;
  t_safe_region region;
  unique_lock<std::mutex> lock;
  
  if (this->v_internal == *(t_internal **)(in_FS_OFFSET + -0x28)) {
    pwVar2 = L"current thread can not be joined.";
    sStack_40 = 0x21;
  }
  else {
    lVar1 = *(long *)(in_FS_OFFSET + -0x60);
    if ((t_thread *)(*(long *)(lVar1 + 0x4b8) + 0x48) != this) {
      t_safe_region::t_safe_region(&region);
      std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)(lVar1 + 0x380));
      while (this->v_internal != (t_internal *)0x0) {
        std::condition_variable::wait((unique_lock *)(lVar1 + 0x3a8));
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      t_safe_region::~t_safe_region(&region);
      return;
    }
    pwVar2 = L"engine thread can not be joined.";
    sStack_40 = 0x20;
  }
  a_message._M_str = pwVar2;
  a_message._M_len = sStack_40;
  f_throw(a_message);
}

Assistant:

void t_thread::f_join()
{
	if (v_internal == v_current) f_throw(L"current thread can not be joined."sv);
	auto engine = f_engine();
	if (this == &engine->v_thread->f_as<t_thread>()) f_throw(L"engine thread can not be joined."sv);
	t_safe_region region;
	std::unique_lock lock(engine->v_thread__mutex);
	while (v_internal) engine->v_thread__condition.wait(lock);
}